

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::list<int,ft::allocator<int>>::mergeSort<ft::less<int>>
          (list<int,ft::allocator<int>> *this,list<int,_ft::allocator<int>_> *first)

{
  undefined1 auStack_48 [8];
  list<int,_ft::allocator<int>_> second;
  
  if (1 < first->m_size) {
    auStack_48 = (undefined1  [8])0x0;
    second.m_head = (node *)0x0;
    second.m_tail = (node *)0x0;
    auStack_48 = (undefined1  [8])operator_new(0x18);
    second.m_head = (node *)operator_new(0x18);
    *(int *)auStack_48 = 0;
    *(listNode<int> **)((long)auStack_48 + 8) = (listNode<int> *)0x0;
    *(listNode<int> **)((long)auStack_48 + 0x10) = (listNode<int> *)0x0;
    (second.m_head)->data = 0;
    (second.m_head)->prev = (listNode<int> *)0x0;
    (second.m_head)->next = (listNode<int> *)0x0;
    *(node **)((long)auStack_48 + 0x10) = second.m_head;
    (second.m_head)->prev = (listNode<int> *)auStack_48;
    list<int,_ft::allocator<int>_>::split
              ((list<int,_ft::allocator<int>_> *)this,first,
               (list<int,_ft::allocator<int>_> *)auStack_48);
    mergeSort<ft::less<int>>(this,first);
    mergeSort<ft::less<int>>(this,auStack_48);
    merge<ft::less<int>>((list<int,ft::allocator<int>> *)first,auStack_48);
    list<int,_ft::allocator<int>_>::~list((list<int,_ft::allocator<int>_> *)auStack_48);
  }
  return;
}

Assistant:

void mergeSort(list & first, Compare comp) {
		if (first.size() > 1) {
			list	second;
			this->split(first, second);

			this->mergeSort(first, comp);
			this->mergeSort(second, comp);

			first.merge(second, comp);
		}
	}